

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::makeLargest(IEEEFloat *this,bool Negative)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  Significand *__s;
  
  this->field_0x12 = Negative << 3 | this->field_0x12 & 0xf0 | 2;
  this->exponent = this->semantics->maxExponent;
  uVar3 = this->semantics->precision;
  if (uVar3 - 0x40 < 0xffffff80) {
    __s = (Significand *)(this->significand).parts;
  }
  else {
    __s = &this->significand;
  }
  uVar3 = uVar3 + 0x40;
  uVar2 = (ulong)((uVar3 >> 6) - 1);
  memset(__s,0xff,uVar2 * 8);
  uVar3 = (uVar3 & 0xffffffc0) - this->semantics->precision;
  uVar1 = 0;
  if (uVar3 < 0x40) {
    uVar1 = 0xffffffffffffffff >> ((byte)uVar3 & 0x3f);
  }
  __s[uVar2].part = uVar1;
  return;
}

Assistant:

void IEEEFloat::makeLargest(bool Negative) {
  // We want (in interchange format):
  //   sign = {Negative}
  //   exponent = 1..10
  //   significand = 1..1
  category = fcNormal;
  sign = Negative;
  exponent = semantics->maxExponent;

  // Use memset to set all but the highest integerPart to all ones.
  integerPart *significand = significandParts();
  unsigned PartCount = partCount();
  memset(significand, 0xFF, sizeof(integerPart)*(PartCount - 1));

  // Set the high integerPart especially setting all unused top bits for
  // internal consistency.
  const unsigned NumUnusedHighBits =
    PartCount*integerPartWidth - semantics->precision;
  significand[PartCount - 1] = (NumUnusedHighBits < integerPartWidth)
                                   ? (~integerPart(0) >> NumUnusedHighBits)
                                   : 0;
}